

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O3

BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
          (BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>
           *__return_storage_ptr__,
          DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
          *this,InterfaceHandle *searchValue)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  Input **ppIVar5;
  Input *pIVar6;
  _Base_ptr p_Var7;
  
  p_Var7 = (this->lookup2)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 == (_Base_ptr)0x0) {
LAB_00212007:
    iVar2 = (this->dataStorage).bsize;
    ppIVar5 = (this->dataStorage).dataptr;
    if ((long)iVar2 == 0x20) {
      if (ppIVar5 == (Input **)0x0) {
        ppIVar5 = (Input **)
                  &StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                   emptyValue;
      }
      else {
        ppIVar5 = ppIVar5 + (long)(this->dataStorage).dataSlotIndex + 1;
      }
      pIVar6 = *ppIVar5;
      iVar2 = 0;
    }
    else {
      ppIVar5 = ppIVar5 + (this->dataStorage).dataSlotIndex;
      pIVar6 = *ppIVar5 + iVar2;
    }
    __return_storage_ptr__->vec = ppIVar5;
    __return_storage_ptr__->ptr = pIVar6;
    __return_storage_ptr__->offset = iVar2;
    return __return_storage_ptr__;
  }
  p_Var1 = &(this->lookup2)._M_t._M_impl.super__Rb_tree_header;
  iVar2 = searchValue->hid;
  p_Var4 = &p_Var1->_M_header;
  do {
    if (iVar2 <= (int)p_Var7[1]._M_color) {
      p_Var4 = p_Var7;
    }
    p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < iVar2];
  } while (p_Var7 != (_Base_ptr)0x0);
  if (((_Rb_tree_header *)p_Var4 == p_Var1) || (iVar2 < (int)p_Var4[1]._M_color)) goto LAB_00212007;
  if ((this->dataStorage).csize == 0) {
    iVar2 = (this->dataStorage).bsize;
    ppIVar5 = (this->dataStorage).dataptr;
    if ((long)iVar2 != 0x20) {
      ppIVar5 = ppIVar5 + (this->dataStorage).dataSlotIndex;
      pIVar6 = *ppIVar5 + iVar2;
      goto LAB_00212062;
    }
    if (ppIVar5 == (Input **)0x0) {
      ppIVar5 = (Input **)
                &StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                 emptyValue;
    }
    else {
      ppIVar5 = ppIVar5 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppIVar5 = (this->dataStorage).dataptr;
  }
  pIVar6 = *ppIVar5;
  iVar2 = 0;
LAB_00212062:
  p_Var7 = p_Var4[1]._M_parent;
  __return_storage_ptr__->vec = ppIVar5;
  __return_storage_ptr__->ptr = pIVar6 + (long)p_Var7;
  uVar3 = (int)p_Var7 + iVar2;
  __return_storage_ptr__->offset = uVar3;
  if ((int)uVar3 < 0x20) {
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->vec = ppIVar5 + (ulong)(uVar3 - 0x20 >> 5) + 1;
  __return_storage_ptr__->offset = uVar3 & 0x1f;
  __return_storage_ptr__->ptr = ppIVar5[(ulong)(uVar3 - 0x20 >> 5) + 1] + (uVar3 & 0x1f);
  return __return_storage_ptr__;
}

Assistant:

auto find(const searchType2& searchValue) const
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }